

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Value control_q_or_none_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar3;
  Am_Input_Char local_3c;
  undefined1 local_35;
  undefined4 local_34;
  Am_Widget_Look local_30 [2];
  Am_Widget_Look look;
  Am_Object local_20;
  Am_Object widget;
  Am_Object *self_local;
  Am_Value *v;
  
  pAVar2 = Am_Object::Get(in_RSI,0x170,3);
  Am_Object::Am_Object(&local_20,pAVar2);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x17f,4);
    Am_Widget_Look::Am_Widget_Look(local_30,pAVar2);
    bVar1 = Am_Widget_Look::operator==(local_30,&Am_WINDOWS_LOOK);
    if (bVar1) {
      Am_Value::Am_Value((Am_Value *)self,&Am_No_Value);
      goto LAB_00320add;
    }
  }
  local_35 = 0;
  Am_Input_Char::Am_Input_Char(&local_3c,"CONTROL_q",true);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)self);
  local_35 = 1;
LAB_00320add:
  local_34 = 1;
  Am_Object::~Am_Object(&local_20);
  AVar3.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar3._0_8_ = self;
  return AVar3;
}

Assistant:

Am_Define_Formula(Am_Value, control_q_or_none)
{
  Am_Object widget = self.Get(Am_SAVED_OLD_OWNER, Am_RETURN_ZERO_ON_ERROR);
  if (widget.Valid()) {
    Am_Widget_Look look = widget.Get(Am_WIDGET_LOOK, Am_NO_DEPENDENCY);
    if (look == Am_WINDOWS_LOOK)
      return Am_No_Value;
  }
  Am_Value v = Am_Input_Char("CONTROL_q");
  return v;
}